

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::RaceSuccessfulPromiseNode<void>::RaceSuccessfulPromiseNode
          (RaceSuccessfulPromiseNode<void> *this,
          Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *promises,
          SourceLocation location)

{
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *other;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_30;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *local_18;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *promises_local;
  RaceSuccessfulPromiseNode<void> *this_local;
  
  (this->super_RaceSuccessfulPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00d9b4e8;
  local_18 = promises;
  promises_local = (Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)this;
  other = mv<kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>>(promises);
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::Array(&local_30,other);
  RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase
            (&this->super_RaceSuccessfulPromiseNodeBase,&local_30,
             &(this->output).super_ExceptionOrValue,location);
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Array(&local_30);
  (this->super_RaceSuccessfulPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00d9b4e8;
  ExceptionOr<kj::_::Void>::ExceptionOr(&this->output);
  return;
}

Assistant:

RaceSuccessfulPromiseNode<void>::RaceSuccessfulPromiseNode(
    Array<OwnPromiseNode> promises, SourceLocation location)
    : RaceSuccessfulPromiseNodeBase(kj::mv(promises), output, location) {}